

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O3

int libwebvtt::Parser::ParseTimingsLine
              (string *line_ptr,size_type arrow_pos,Time *start_time,Time *stop_time,
              settings_t *settings)

{
  char cVar1;
  size_type sVar2;
  int iVar3;
  size_type idx;
  size_type local_28;
  
  iVar3 = -1;
  if ((arrow_pos != 0xffffffffffffffff && line_ptr != (string *)0x0) &&
     (arrow_pos < line_ptr->_M_string_length)) {
    (line_ptr->_M_dataplus)._M_p[arrow_pos] = '\0';
    local_28 = 0;
    iVar3 = ParseTime(line_ptr,&local_28,start_time);
    if (iVar3 == 0) {
      sVar2 = local_28;
      do {
        do {
          local_28 = sVar2;
          cVar1 = (line_ptr->_M_dataplus)._M_p[local_28];
          sVar2 = local_28 + 1;
        } while (cVar1 == '\t');
      } while (cVar1 == ' ');
      if (cVar1 == '\0') {
        std::__cxx11::string::push_back((char)line_ptr);
        local_28 = arrow_pos + 3;
        iVar3 = ParseTime(line_ptr,&local_28,stop_time);
        if (iVar3 == 0) {
          iVar3 = ParseSettings(line_ptr,local_28,settings);
        }
      }
      else {
        iVar3 = -1;
      }
    }
  }
  return iVar3;
}

Assistant:

int Parser::ParseTimingsLine(std::string* line_ptr,
                             std::string::size_type arrow_pos, Time* start_time,
                             Time* stop_time, Cue::settings_t* settings) {
  if (line_ptr == NULL)
    return -1;

  std::string& line = *line_ptr;

  if (arrow_pos == std::string::npos || arrow_pos >= line.length())
    return -1;

  // Place a NUL character at the start of the arrow token, in
  // order to demarcate the start time from remainder of line.
  line[arrow_pos] = kNUL;
  std::string::size_type idx = 0;

  int e = ParseTime(line, &idx, start_time);
  if (e)  // error
    return e;

  // Detect any junk that follows the start time,
  // but precedes the arrow symbol.

  while (char c = line[idx]) {
    if (c != kSPACE && c != kTAB)
      return -1;
    ++idx;
  }

  // Place a NUL character at the end of the line,
  // so the scanner has a place to stop, and begin
  // the scan just beyond the arrow token.

  line.push_back(kNUL);
  idx = arrow_pos + 3;

  e = ParseTime(line, &idx, stop_time);
  if (e)  // error
    return e;

  e = ParseSettings(line, idx, settings);
  if (e)  // error
    return e;

  return 0;  // success
}